

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v11::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  int iVar2;
  make_unsigned_t<int> mVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  int i;
  long lVar12;
  int j;
  long lVar13;
  bool bVar14;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> n;
  
  uVar4 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = (int)uVar4;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
  basic_memory_buffer(&n,&this->bigits_);
  mVar3 = to_unsigned<int>(iVar2 * 2);
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,(ulong)mVar3);
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < iVar2) {
    uVar7 = uVar4 & 0xffffffff;
  }
  uVar4 = 0;
  uVar5 = 0;
  for (; puVar9 = n.super_buffer<unsigned_int>.ptr_, uVar10 = uVar6, uVar6 != uVar7;
      uVar6 = uVar6 + 1) {
    for (; uVar10 != 0xffffffffffffffff; uVar10 = uVar10 - 1) {
      bVar14 = CARRY8(uVar4,(ulong)n.super_buffer<unsigned_int>.ptr_[uVar10 & 0xffffffff] *
                            (ulong)*puVar9);
      uVar4 = uVar4 + (ulong)n.super_buffer<unsigned_int>.ptr_[uVar10 & 0xffffffff] * (ulong)*puVar9
      ;
      uVar5 = uVar5 + bVar14;
      puVar9 = puVar9 + 1;
    }
    puVar1[uVar6] = (uint)uVar4;
    uVar4 = uVar4 >> 0x20 | uVar5 << 0x20;
    uVar5 = uVar5 >> 0x20;
  }
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  iVar8 = 1;
  for (lVar11 = (long)iVar2; lVar11 < iVar2 * 2; lVar11 = lVar11 + 1) {
    lVar13 = (long)(iVar2 + -1);
    for (lVar12 = (long)iVar8; lVar12 < iVar2; lVar12 = lVar12 + 1) {
      puVar9 = n.super_buffer<unsigned_int>.ptr_ + lVar13;
      lVar13 = lVar13 + -1;
      bVar14 = CARRY8(uVar4,(ulong)*puVar9 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar12]);
      uVar4 = uVar4 + (ulong)*puVar9 * (ulong)n.super_buffer<unsigned_int>.ptr_[lVar12];
      uVar5 = uVar5 + bVar14;
    }
    puVar1[lVar11] = (uint)uVar4;
    uVar4 = uVar4 >> 0x20 | uVar5 << 0x20;
    uVar5 = uVar5 >> 0x20;
    iVar8 = iVar8 + 1;
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::deallocate
            (&n);
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += double_bigit(n[i]) * n[j];
      }
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += double_bigit(n[i++]) * n[j--];
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }